

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O3

void __thiscall UnifiedRegex::LoopNode::Emit(LoopNode *this,Compiler *compiler,CharCount *skipped)

{
  CharCount CVar1;
  undefined4 uVar2;
  CharSetNode *pCVar3;
  CountDomain CVar4;
  size_t sVar5;
  code *pcVar6;
  uint uVar7;
  bool bVar8;
  char16 cVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  Label LVar13;
  undefined4 *puVar14;
  Node *pNVar15;
  Node *pNVar16;
  byte *pbVar17;
  uint8 *puVar18;
  uint8 *puVar19;
  CharCount CVar20;
  CharSet<char16_t> *pCVar21;
  ArenaAllocator *allocator;
  RuntimeCharSet<char16_t> *pRVar22;
  uint uVar23;
  LoopNode *pLVar24;
  Label *pLVar25;
  undefined4 local_44;
  undefined2 uStack_40;
  undefined6 uStack_3e;
  int maxBodyGroupId;
  uint local_34 [2];
  int minBodyGroupId;
  
  ThreadContext::ProbeStackNoDispose
            (compiler->scriptContext->threadContext,0x6000,compiler->scriptContext,(PVOID)0x0);
  if (*skipped != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar14 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                       ,0xf49,"(skipped == 0)","skipped == 0");
    if (!bVar8) goto LAB_00ea0cfb;
    *puVar14 = 0;
  }
  switch(this->scheme) {
  case BeginEnd:
    local_34[0] = (uint)compiler->program->numGroups;
    local_44 = 0xffffffff;
    (*this->body->_vptr_Node[0x10])(this->body,compiler->scriptContext,local_34,&local_44);
    _uStack_40 = (LoopNode *)CONCAT44(maxBodyGroupId,compiler->instNext);
    puVar19 = Compiler::Emit(compiler,0x1c);
    iVar12 = compiler->nextLoopId;
    compiler->nextLoopId = iVar12 + 1;
    uVar10 = *(uint *)&(this->super_Node).field_0xc;
    uVar23 = *(uint *)&this->body->field_0xc;
    bVar8 = this->isGreedy;
    *puVar19 = 'D';
    *(int *)(puVar19 + 1) = iVar12;
    CVar4 = this->repeats;
    puVar19[0xd] = (uVar10 >> 10 & 1) == 0;
    *(CountDomain *)(puVar19 + 5) = CVar4;
    puVar19[0xe] = (uVar23 >> 9 & 1) == 0;
    puVar18 = puVar19 + 0xf;
    puVar19[0xf] = 0xff;
    puVar19[0x10] = 0xff;
    puVar19[0x11] = 0xff;
    puVar19[0x12] = 0xff;
    *(uint *)(puVar19 + 0x13) = local_34[0];
    *(undefined4 *)(puVar19 + 0x17) = local_44;
    puVar19[0x1b] = bVar8;
    puVar19 = compiler->instBuf;
    if ((puVar18 < puVar19) || (puVar19 + compiler->instNext <= puVar18)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                         ,0x272,"((uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext)"
                         ,"(uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext");
      if (!bVar8) goto LAB_00ea0cfb;
      *puVar14 = 0;
      puVar19 = compiler->instBuf;
    }
    LVar13 = (int)puVar18 - (int)puVar19;
    (*this->body->_vptr_Node[0x11])(this->body,compiler,skipped);
    pbVar17 = Compiler::Emit(compiler,5);
    *pbVar17 = 0x45;
    goto LAB_00ea07ab;
  default:
    goto switchD_00e9f4c1_caseD_1;
  case Chomp:
    uVar10 = (this->repeats).lower;
    bVar8 = (this->repeats).upper != 0xffffffff;
    if ((this->body->firstSet->rep).compact.countPlusOne == 2) {
      if (bVar8 || 1 < uVar10) {
        puVar18 = Compiler::Emit(compiler,0xb);
        cVar9 = CharSet<char16_t>::Singleton(this->body->firstSet);
        *puVar18 = 'Z';
        *(char16 *)(puVar18 + 1) = cVar9;
        *(CountDomain *)(puVar18 + 3) = this->repeats;
        return;
      }
      puVar18 = Compiler::Emit(compiler,3);
      cVar9 = CharSet<char16_t>::Singleton(this->body->firstSet);
      if (uVar10 == 0) {
        *puVar18 = 'R';
      }
      else {
        *puVar18 = 'S';
      }
LAB_00ea04a1:
      *(char16 *)(puVar18 + 1) = cVar9;
      return;
    }
    if (!bVar8 && 1 >= uVar10) {
      puVar18 = Compiler::Emit(compiler,0x29);
      pRVar22 = (RuntimeCharSet<char16_t> *)(puVar18 + 1);
      if (uVar10 == 0) {
        *puVar18 = 'T';
      }
      else {
        *puVar18 = 'U';
      }
      goto LAB_00ea0687;
    }
    puVar18 = Compiler::Emit(compiler,0x31);
    *puVar18 = '[';
    pRVar22 = (RuntimeCharSet<char16_t> *)(puVar18 + 1);
    RuntimeCharSet<char16_t>::RuntimeCharSet(pRVar22);
    *(CountDomain *)(puVar18 + 0x29) = this->repeats;
    allocator = compiler->rtAllocator;
    goto LAB_00ea0812;
  case ChompGroupLastChar:
    pNVar15 = this->body;
    if (pNVar15->tag != DefineGroup) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xf91,"(body->tag == DefineGroup)","body->tag == DefineGroup");
      if (!bVar8) goto LAB_00ea0cfb;
      *puVar14 = 0;
      pNVar15 = this->body;
    }
    puVar18 = Compiler::Emit(compiler,0x36);
    uVar2 = *(undefined4 *)&pNVar15[1].tag;
    bVar8 = this->noNeedToSave;
    *puVar18 = '\\';
    pRVar22 = (RuntimeCharSet<char16_t> *)(puVar18 + 1);
    RuntimeCharSet<char16_t>::RuntimeCharSet(pRVar22);
    *(CountDomain *)(puVar18 + 0x29) = this->repeats;
    *(undefined4 *)(puVar18 + 0x31) = uVar2;
    puVar18[0x35] = bVar8;
    allocator = compiler->rtAllocator;
LAB_00ea0812:
    pNVar15 = this->body;
LAB_00ea0816:
    pCVar21 = pNVar15->firstSet;
LAB_00ea081d:
    RuntimeCharSet<char16_t>::CloneFrom(pRVar22,allocator,pCVar21);
    return;
  case Guarded:
    local_34[0] = (uint)compiler->program->numGroups;
    local_44 = 0xffffffff;
    (*this->body->_vptr_Node[0x10])(this->body,compiler->scriptContext);
    _uStack_40 = (LoopNode *)CONCAT44(maxBodyGroupId,compiler->instNext);
    if ((this->body->firstSet->rep).compact.countPlusOne == 2) {
      puVar19 = Compiler::Emit(compiler,0x1d);
      cVar9 = CharSet<char16_t>::Singleton(this->body->firstSet);
      iVar12 = compiler->nextLoopId;
      compiler->nextLoopId = iVar12 + 1;
      uVar10 = *(uint *)&(this->super_Node).field_0xc;
      uVar23 = *(uint *)&this->body->field_0xc;
      *puVar19 = 'F';
      *(char16 *)(puVar19 + 1) = cVar9;
      *(int *)(puVar19 + 3) = iVar12;
      CVar4 = this->repeats;
      puVar19[0xf] = (uVar10 >> 10 & 1) == 0;
      *(CountDomain *)(puVar19 + 7) = CVar4;
      puVar19[0x10] = (uVar23 >> 9 & 1) == 0;
      puVar18 = puVar19 + 0x11;
      puVar19[0x11] = 0xff;
      puVar19[0x12] = 0xff;
      puVar19[0x13] = 0xff;
      puVar19[0x14] = 0xff;
      *(uint *)(puVar19 + 0x15) = local_34[0];
      *(undefined4 *)(puVar19 + 0x19) = local_44;
      puVar19 = compiler->instBuf;
      if ((puVar18 < puVar19) || (puVar19 + compiler->instNext <= puVar18)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar14 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                           ,0x272,
                           "((uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext)",
                           "(uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext");
joined_r0x00ea075c:
        if (!bVar8) goto LAB_00ea0cfb;
        *puVar14 = 0;
        puVar19 = compiler->instBuf;
      }
    }
    else {
      puVar19 = Compiler::Emit(compiler,0x43);
      uVar7 = local_34[0];
      uVar2 = local_44;
      iVar12 = compiler->nextLoopId;
      compiler->nextLoopId = iVar12 + 1;
      uVar10 = *(uint *)&(this->super_Node).field_0xc;
      uVar23 = *(uint *)&this->body->field_0xc;
      *puVar19 = 'G';
      RuntimeCharSet<char16_t>::RuntimeCharSet((RuntimeCharSet<char16_t> *)(puVar19 + 1));
      *(int *)(puVar19 + 0x29) = iVar12;
      CVar4 = this->repeats;
      puVar19[0x35] = (uVar10 >> 10 & 1) == 0;
      *(CountDomain *)(puVar19 + 0x2d) = CVar4;
      puVar19[0x36] = (uVar23 >> 9 & 1) == 0;
      puVar18 = puVar19 + 0x37;
      puVar19[0x37] = 0xff;
      puVar19[0x38] = 0xff;
      puVar19[0x39] = 0xff;
      puVar19[0x3a] = 0xff;
      *(uint *)(puVar19 + 0x3b) = uVar7;
      *(undefined4 *)(puVar19 + 0x3f) = uVar2;
      RuntimeCharSet<char16_t>::CloneFrom
                ((RuntimeCharSet<char16_t> *)(puVar19 + 1),compiler->rtAllocator,
                 this->body->firstSet);
      puVar19 = compiler->instBuf;
      if ((puVar18 < puVar19) || (puVar19 + compiler->instNext <= puVar18)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar14 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                           ,0x272,
                           "((uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext)",
                           "(uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext");
        goto joined_r0x00ea075c;
      }
    }
    LVar13 = (int)puVar18 - (int)puVar19;
    (*this->body->_vptr_Node[0x11])(this->body,compiler,skipped);
    sVar5 = (this->body->firstSet->rep).compact.countPlusOne;
    pbVar17 = Compiler::Emit(compiler,5);
    *pbVar17 = sVar5 == 2 ^ 0x49;
LAB_00ea07ab:
    *(CharCount *)(pbVar17 + 1) = _uStack_40;
    break;
  case Fixed:
    pNVar15 = this->body;
    if ((pNVar15->features & 0x100) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xfc1,"(!body->ContainsDefineGroup())","!body->ContainsDefineGroup()");
      if (!bVar8) goto LAB_00ea0cfb;
      *puVar14 = 0;
      pNVar15 = this->body;
    }
    CVar20 = (pNVar15->thisConsumes).lower;
    if (CVar20 != (pNVar15->thisConsumes).upper) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xfc2,"(body->thisConsumes.IsFixed())","body->thisConsumes.IsFixed()");
      if (!bVar8) goto LAB_00ea0cfb;
      *puVar14 = 0;
      pNVar15 = this->body;
      CVar20 = (pNVar15->thisConsumes).lower;
    }
    if (CVar20 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xfc3,"(body->thisConsumes.lower > 0)","body->thisConsumes.lower > 0");
      if (!bVar8) goto LAB_00ea0cfb;
      *puVar14 = 0;
      pNVar15 = this->body;
    }
    if ((pNVar15->field_0xd & 2) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xfc4,"(body->isDeterministic)","body->isDeterministic");
      if (!bVar8) goto LAB_00ea0cfb;
      *puVar14 = 0;
    }
    CVar20 = compiler->instNext;
    puVar19 = Compiler::Emit(compiler,0x17);
    iVar12 = compiler->nextLoopId;
    compiler->nextLoopId = iVar12 + 1;
    uVar10 = *(uint *)&(this->super_Node).field_0xc;
    CVar1 = (this->body->thisConsumes).lower;
    *puVar19 = 'J';
    *(int *)(puVar19 + 1) = iVar12;
    *(CountDomain *)(puVar19 + 5) = this->repeats;
    puVar19[0xd] = (uVar10 >> 10 & 1) == 0;
    puVar19[0xe] = '\0';
    puVar18 = puVar19 + 0xf;
    puVar19[0xf] = 0xff;
    puVar19[0x10] = 0xff;
    puVar19[0x11] = 0xff;
    puVar19[0x12] = 0xff;
    *(CharCount *)(puVar19 + 0x13) = CVar1;
    puVar19 = compiler->instBuf;
    if ((puVar18 < puVar19) || (puVar19 + compiler->instNext <= puVar18)) {
      _uStack_40 = (LoopNode *)CONCAT44(maxBodyGroupId,CVar20);
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                         ,0x272,"((uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext)"
                         ,"(uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext");
      if (!bVar8) goto LAB_00ea0cfb;
      *puVar14 = 0;
      puVar19 = compiler->instBuf;
      CVar20 = _uStack_40;
    }
    LVar13 = (int)puVar18 - (int)puVar19;
    (*this->body->_vptr_Node[0x11])(this->body,compiler,skipped);
    puVar18 = Compiler::Emit(compiler,5);
    *puVar18 = 'K';
    *(CharCount *)(puVar18 + 1) = CVar20;
    break;
  case FixedSet:
    pNVar15 = this->body;
    if (((((pNVar15->features & 0x110e) != 0) || ((*(uint *)&pNVar15->field_0xc & 2) != 0)) ||
        ((*(uint *)&pNVar15->field_0xc & 1) == 0)) ||
       (((pNVar15->thisConsumes).lower != 1 || ((pNVar15->thisConsumes).upper != 1)))) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xfd4,"(body->IsSimpleOneChar())","body->IsSimpleOneChar()");
      if (!bVar8) goto LAB_00ea0cfb;
      *puVar14 = 0;
    }
    if ((this->followFirst == L'\xffff') ||
       (bVar8 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,RegexOptBTPhase), bVar8)) {
      puVar18 = Compiler::Emit(compiler,0x36);
      iVar12 = compiler->nextLoopId;
      compiler->nextLoopId = iVar12 + 1;
      uVar10 = *(uint *)&(this->super_Node).field_0xc;
      *puVar18 = 'L';
      pRVar22 = (RuntimeCharSet<char16_t> *)(puVar18 + 1);
      RuntimeCharSet<char16_t>::RuntimeCharSet(pRVar22);
      *(int *)(puVar18 + 0x29) = iVar12;
      *(CountDomain *)(puVar18 + 0x2d) = this->repeats;
      puVar18[0x35] = (uVar10 >> 10 & 1) == 0;
    }
    else {
      puVar18 = Compiler::Emit(compiler,0x38);
      iVar12 = compiler->nextLoopId;
      compiler->nextLoopId = iVar12 + 1;
      uVar10 = *(uint *)&(this->super_Node).field_0xc;
      _uStack_40 = (LoopNode *)CONCAT62(uStack_3e,this->followFirst);
      *puVar18 = 'M';
      pRVar22 = (RuntimeCharSet<char16_t> *)(puVar18 + 1);
      RuntimeCharSet<char16_t>::RuntimeCharSet(pRVar22);
      *(int *)(puVar18 + 0x29) = iVar12;
      *(CountDomain *)(puVar18 + 0x2d) = this->repeats;
      puVar18[0x35] = (uVar10 >> 10 & 1) == 0;
      *(undefined2 *)(puVar18 + 0x36) = uStack_40;
    }
    allocator = compiler->rtAllocator;
    pNVar15 = this->body;
    goto LAB_00ea0816;
  case FixedGroupLastIteration:
    pNVar15 = this->body;
    if (pNVar15->tag != DefineGroup) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xfea,"(body->tag == DefineGroup)","body->tag == DefineGroup");
      if (!bVar8) goto LAB_00ea0cfb;
      *puVar14 = 0;
      pNVar15 = this->body;
    }
    CVar20 = (pNVar15->thisConsumes).lower;
    pNVar16 = pNVar15;
    if (CVar20 != (pNVar15->thisConsumes).upper) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xfec,"(body->thisConsumes.IsFixed())","body->thisConsumes.IsFixed()");
      if (!bVar8) goto LAB_00ea0cfb;
      *puVar14 = 0;
      pNVar16 = this->body;
      CVar20 = (pNVar16->thisConsumes).lower;
    }
    if (CVar20 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xfed,"(body->thisConsumes.lower > 0)","body->thisConsumes.lower > 0");
      if (!bVar8) goto LAB_00ea0cfb;
      *puVar14 = 0;
      pNVar16 = this->body;
    }
    if ((pNVar16->field_0xd & 2) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xfee,"(body->isDeterministic)","body->isDeterministic");
      if (!bVar8) goto LAB_00ea0cfb;
      *puVar14 = 0;
    }
    _uStack_40 = (LoopNode *)CONCAT44(maxBodyGroupId,compiler->instNext);
    puVar19 = Compiler::Emit(compiler,0x1c);
    iVar12 = compiler->nextLoopId;
    compiler->nextLoopId = iVar12 + 1;
    uVar10 = *(uint *)&(this->super_Node).field_0xc;
    CVar20 = (this->body->thisConsumes).lower;
    uVar2 = *(undefined4 *)&pNVar15[1].tag;
    bVar8 = this->noNeedToSave;
    *puVar19 = 'N';
    *(int *)(puVar19 + 1) = iVar12;
    *(CountDomain *)(puVar19 + 5) = this->repeats;
    puVar19[0xd] = (uVar10 >> 10 & 1) == 0;
    puVar19[0xe] = '\0';
    puVar18 = puVar19 + 0xf;
    puVar19[0xf] = 0xff;
    puVar19[0x10] = 0xff;
    puVar19[0x11] = 0xff;
    puVar19[0x12] = 0xff;
    *(CharCount *)(puVar19 + 0x13) = CVar20;
    *(undefined4 *)(puVar19 + 0x17) = uVar2;
    puVar19[0x1b] = bVar8;
    puVar19 = compiler->instBuf;
    if ((puVar18 < puVar19) || (puVar19 + compiler->instNext <= puVar18)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                         ,0x272,"((uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext)"
                         ,"(uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext");
      if (!bVar8) goto LAB_00ea0cfb;
      *puVar14 = 0;
      puVar19 = compiler->instBuf;
    }
    uVar10 = (int)puVar18 - (int)puVar19;
    (**(code **)(*pNVar15[1]._vptr_Node + 0x88))(pNVar15[1]._vptr_Node,compiler,skipped);
    puVar18 = Compiler::Emit(compiler,5);
    *puVar18 = 'O';
    *(CharCount *)(puVar18 + 1) = _uStack_40;
    goto LAB_00ea0201;
  case GreedyNoBacktrack:
    if ((this->body->features & 0x100) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0x1001,"(!body->ContainsDefineGroup())","!body->ContainsDefineGroup()");
      if (!bVar8) goto LAB_00ea0cfb;
      *puVar14 = 0;
    }
    if (this->isGreedy == false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0x1002,"(isGreedy)","isGreedy");
      if (!bVar8) goto LAB_00ea0cfb;
      *puVar14 = 0;
    }
    if ((this->repeats).lower != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0x1003,"(repeats.lower == 0)","repeats.lower == 0");
      if (!bVar8) goto LAB_00ea0cfb;
      *puVar14 = 0;
    }
    if ((this->repeats).upper != 0xffffffff) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0x1004,"(repeats.upper == CharCountFlag)","repeats.upper == CharCountFlag"
                        );
      if (!bVar8) goto LAB_00ea0cfb;
      *puVar14 = 0;
    }
    if ((this->body->field_0xd & 2) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0x1005,"(body->isDeterministic)","body->isDeterministic");
      if (!bVar8) goto LAB_00ea0cfb;
      *puVar14 = 0;
    }
    CVar20 = compiler->instNext;
    puVar19 = Compiler::Emit(compiler,9);
    iVar12 = compiler->nextLoopId;
    compiler->nextLoopId = iVar12 + 1;
    *puVar19 = 'P';
    *(int *)(puVar19 + 1) = iVar12;
    puVar19 = puVar19 + 5;
    puVar18 = compiler->instBuf;
    if ((puVar19 < puVar18) || (puVar18 + compiler->instNext <= puVar19)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                         ,0x272,"((uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext)"
                         ,"(uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext");
      if (!bVar8) goto LAB_00ea0cfb;
      *puVar14 = 0;
      puVar18 = compiler->instBuf;
    }
    uVar10 = (int)puVar19 - (int)puVar18;
    (*this->body->_vptr_Node[0x11])(this->body,compiler,skipped);
    puVar18 = Compiler::Emit(compiler,5);
    *puVar18 = 'Q';
    *(CharCount *)(puVar18 + 1) = CVar20;
LAB_00ea0201:
    uVar23 = compiler->instNext;
    if (uVar23 <= uVar10) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                         ,0x278,"(fixup < instNext)","fixup < instNext");
      if (!bVar8) goto LAB_00ea0cfb;
      *puVar14 = 0;
      if (compiler->instNext < uVar23) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar14 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                           ,0x279,"(label <= instNext)","label <= instNext");
        if (!bVar8) goto LAB_00ea0cfb;
        *puVar14 = 0;
      }
    }
    puVar18 = compiler->instBuf;
LAB_00ea0a21:
    *(uint *)(puVar18 + uVar10) = uVar23;
    return;
  case Set:
    pNVar15 = this->body;
    if (((pNVar15->features & 0x100) != 0) && ((pNVar15->thisConsumes).lower == 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0x1015,
                         "(!body->ContainsDefineGroup() || !body->thisConsumes.CouldMatchEmpty())",
                         "!body->ContainsDefineGroup() || !body->thisConsumes.CouldMatchEmpty()");
      if (!bVar8) goto LAB_00ea0cfb;
      *puVar14 = 0;
      pNVar15 = this->body;
    }
    if ((pNVar15->firstSet->rep).compact.countPlusOne == 2) {
      puVar18 = Compiler::Emit(compiler,3);
      cVar9 = CharSet<char16_t>::Singleton(this->body->firstSet);
      *puVar18 = '#';
      goto LAB_00ea04a1;
    }
    puVar18 = Compiler::Emit(compiler,0x29);
    *puVar18 = '$';
    pRVar22 = (RuntimeCharSet<char16_t> *)(puVar18 + 1);
LAB_00ea0687:
    RuntimeCharSet<char16_t>::RuntimeCharSet(pRVar22);
    allocator = compiler->rtAllocator;
    pCVar21 = this->body->firstSet;
    goto LAB_00ea081d;
  case Chain:
    pNVar15 = this->body;
    if (((pNVar15->features & 0x100) != 0) && ((pNVar15->thisConsumes).lower == 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0x1027,
                         "(!body->ContainsDefineGroup() || !body->thisConsumes.CouldMatchEmpty())",
                         "!body->ContainsDefineGroup() || !body->thisConsumes.CouldMatchEmpty()");
      if (!bVar8) goto LAB_00ea0cfb;
      *puVar14 = 0;
      pNVar15 = this->body;
    }
    local_34[0] = 0;
    sVar5 = (pNVar15->firstSet->rep).compact.countPlusOne;
    _uStack_40 = this;
    iVar12 = (*pNVar15->_vptr_Node[0xb])(pNVar15,compiler);
    if (sVar5 == 2) {
      puVar18 = Compiler::Emit(compiler,7);
      pLVar24 = _uStack_40;
      cVar9 = CharSet<char16_t>::Singleton(_uStack_40->body->firstSet);
      puVar19 = puVar18 + 3;
      if ((char)iVar12 == '\0') {
        *puVar18 = '\x04';
        *(char16 *)(puVar18 + 1) = cVar9;
        puVar18[3] = 0xff;
        puVar18[4] = 0xff;
        puVar18[5] = 0xff;
        puVar18[6] = 0xff;
        puVar18 = compiler->instBuf;
        if ((puVar19 < puVar18) || (puVar18 + compiler->instNext <= puVar19)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar14 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                             ,0x272,
                             "((uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext)",
                             "(uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext");
          if (!bVar8) goto LAB_00ea0cfb;
          *puVar14 = 0;
          puVar18 = compiler->instBuf;
        }
        iVar12 = (int)puVar18;
      }
      else {
        *puVar18 = '\x05';
        *(char16 *)(puVar18 + 1) = cVar9;
        puVar18[3] = 0xff;
        puVar18[4] = 0xff;
        puVar18[5] = 0xff;
        puVar18[6] = 0xff;
        puVar18 = compiler->instBuf;
        if ((puVar19 < puVar18) || (puVar18 + compiler->instNext <= puVar19)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar14 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                             ,0x272,
                             "((uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext)",
                             "(uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext");
          if (!bVar8) goto LAB_00ea0cfb;
          *puVar14 = 0;
          puVar18 = compiler->instBuf;
        }
        iVar12 = (int)puVar18;
        local_34[0] = 1;
      }
      uVar10 = (int)puVar19 - iVar12;
    }
    else {
      puVar18 = Compiler::Emit(compiler,0x2d);
      pLVar24 = _uStack_40;
      pRVar22 = (RuntimeCharSet<char16_t> *)(puVar18 + 1);
      puVar19 = puVar18 + 0x29;
      if ((char)iVar12 == '\0') {
        *puVar18 = '\x06';
        RuntimeCharSet<char16_t>::RuntimeCharSet(pRVar22);
        puVar18[0x29] = 0xff;
        puVar18[0x2a] = 0xff;
        puVar18[0x2b] = 0xff;
        puVar18[0x2c] = 0xff;
        RuntimeCharSet<char16_t>::CloneFrom(pRVar22,compiler->rtAllocator,pLVar24->body->firstSet);
        puVar18 = compiler->instBuf;
        if ((puVar19 < puVar18) || (puVar18 + compiler->instNext <= puVar19)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar14 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                             ,0x272,
                             "((uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext)",
                             "(uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext");
          if (!bVar8) goto LAB_00ea0cfb;
          *puVar14 = 0;
          puVar18 = compiler->instBuf;
        }
        uVar10 = (int)puVar19 - (int)puVar18;
      }
      else {
        *puVar18 = '\a';
        RuntimeCharSet<char16_t>::RuntimeCharSet(pRVar22);
        puVar18[0x29] = 0xff;
        puVar18[0x2a] = 0xff;
        puVar18[0x2b] = 0xff;
        puVar18[0x2c] = 0xff;
        RuntimeCharSet<char16_t>::CloneFrom(pRVar22,compiler->rtAllocator,pLVar24->body->firstSet);
        puVar18 = compiler->instBuf;
        if ((puVar19 < puVar18) || (puVar18 + compiler->instNext <= puVar19)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar14 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                             ,0x272,
                             "((uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext)",
                             "(uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext");
          if (!bVar8) goto LAB_00ea0cfb;
          *puVar14 = 0;
          puVar18 = compiler->instBuf;
        }
        uVar10 = (int)puVar19 - (int)puVar18;
        local_34[0] = 1;
      }
    }
    (*pLVar24->body->_vptr_Node[0x11])(pLVar24->body,compiler,local_34);
    uVar23 = compiler->instNext;
    if (uVar23 <= uVar10) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                         ,0x278,"(fixup < instNext)","fixup < instNext");
      if (!bVar8) goto LAB_00ea0cfb;
      *puVar14 = 0;
      if (compiler->instNext < uVar23) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar14 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                           ,0x279,"(label <= instNext)","label <= instNext");
        if (!bVar8) goto LAB_00ea0cfb;
        *puVar14 = 0;
      }
    }
    puVar18 = compiler->instBuf;
    goto LAB_00ea0a21;
  case Try:
    pNVar15 = this->body;
    if (((pNVar15->features & 0x100) != 0) && ((pNVar15->thisConsumes).lower == 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0x1052,
                         "(!body->ContainsDefineGroup() || !body->thisConsumes.CouldMatchEmpty())",
                         "!body->ContainsDefineGroup() || !body->thisConsumes.CouldMatchEmpty()");
      if (!bVar8) goto LAB_00ea0cfb;
      *puVar14 = 0;
      pNVar15 = this->body;
    }
    local_34[0] = 0;
    if ((pNVar15->thisConsumes).lower == 0) {
LAB_00ea0ab6:
      puVar19 = Compiler::Emit(compiler,5);
      *puVar19 = ']';
      puVar19[1] = 0xff;
      puVar19[2] = 0xff;
      puVar19[3] = 0xff;
      puVar19[4] = 0xff;
      puVar19 = puVar19 + 1;
      puVar18 = compiler->instBuf;
      if ((puVar19 < puVar18) || (puVar18 + compiler->instNext <= puVar19)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar14 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                           ,0x272,
                           "((uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext)",
                           "(uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext");
        if (!bVar8) goto LAB_00ea0cfb;
        *puVar14 = 0;
        puVar18 = compiler->instBuf;
      }
      LVar13 = (int)puVar19 - (int)puVar18;
    }
    else {
      if ((pNVar15->field_0xc & 1) == 0) {
        pCVar21 = pNVar15->firstSet;
        pCVar3 = (pCVar21->rep).full.root;
        if (&DAT_00000004 < (undefined1 *)((long)&pCVar3[-1]._vptr_CharSetNode + 7)) {
          if (pCVar3 == (CharSetNode *)0x0) {
            uVar10 = CharBitvec::Count(&(pCVar21->rep).full.direct);
          }
          else {
            if ((pCVar3 != (CharSetNode *)&CharSetFull::Instance) &&
               (uVar10 = (*pCVar3->_vptr_CharSetNode[0xb])(pCVar3,2), 0xff00 < uVar10)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
              *puVar14 = 1;
              bVar8 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                                 ,0x252,
                                 "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                                 ,
                                 "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                                );
              if (!bVar8) goto LAB_00ea0cfb;
              *puVar14 = 0;
            }
            uVar11 = CharBitvec::Count(&(pCVar21->rep).full.direct);
            pCVar3 = (pCVar21->rep).full.root;
            if (pCVar3 == (CharSetNode *)&CharSetFull::Instance) {
              iVar12 = 0xff00;
            }
            else {
              iVar12 = (*pCVar3->_vptr_CharSetNode[0xb])(pCVar3,2);
            }
            uVar10 = iVar12 + uVar11;
          }
          if (0x14 < uVar10) goto LAB_00ea0ab6;
          pNVar15 = this->body;
        }
      }
      iVar12 = (*pNVar15->_vptr_Node[0xb])(pNVar15,compiler);
      sVar5 = (this->body->firstSet->rep).compact.countPlusOne;
      if ((char)iVar12 == '\0') {
        if (sVar5 == 2) {
          puVar18 = Compiler::Emit(compiler,7);
          cVar9 = CharSet<char16_t>::Singleton(this->body->firstSet);
          *puVar18 = '^';
          *(char16 *)(puVar18 + 1) = cVar9;
          puVar18[3] = 0xff;
          puVar18[4] = 0xff;
          puVar18[5] = 0xff;
          puVar18[6] = 0xff;
          pLVar25 = (Label *)(puVar18 + 3);
        }
        else {
          puVar18 = Compiler::Emit(compiler,0x2d);
          *puVar18 = '`';
          RuntimeCharSet<char16_t>::RuntimeCharSet((RuntimeCharSet<char16_t> *)(puVar18 + 1));
          puVar18[0x29] = 0xff;
          puVar18[0x2a] = 0xff;
          puVar18[0x2b] = 0xff;
          puVar18[0x2c] = 0xff;
          pLVar25 = (Label *)(puVar18 + 0x29);
          RuntimeCharSet<char16_t>::CloneFrom
                    ((RuntimeCharSet<char16_t> *)(puVar18 + 1),compiler->rtAllocator,
                     this->body->firstSet);
        }
        LVar13 = Compiler::GetFixup(compiler,pLVar25);
      }
      else {
        if (sVar5 == 2) {
          puVar18 = Compiler::Emit(compiler,7);
          cVar9 = CharSet<char16_t>::Singleton(this->body->firstSet);
          *puVar18 = '_';
          *(char16 *)(puVar18 + 1) = cVar9;
          puVar18[3] = 0xff;
          puVar18[4] = 0xff;
          puVar18[5] = 0xff;
          puVar18[6] = 0xff;
          pLVar25 = (Label *)(puVar18 + 3);
        }
        else {
          puVar18 = Compiler::Emit(compiler,0x2d);
          *puVar18 = 'a';
          RuntimeCharSet<char16_t>::RuntimeCharSet((RuntimeCharSet<char16_t> *)(puVar18 + 1));
          puVar18[0x29] = 0xff;
          puVar18[0x2a] = 0xff;
          puVar18[0x2b] = 0xff;
          puVar18[0x2c] = 0xff;
          pLVar25 = (Label *)(puVar18 + 0x29);
          RuntimeCharSet<char16_t>::CloneFrom
                    ((RuntimeCharSet<char16_t> *)(puVar18 + 1),compiler->rtAllocator,
                     this->body->firstSet);
        }
        LVar13 = Compiler::GetFixup(compiler,pLVar25);
        local_34[0] = 1;
      }
    }
    (*this->body->_vptr_Node[0x11])(this->body,compiler,local_34);
  }
  uVar10 = compiler->instNext;
  if (uVar10 <= LVar13) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar14 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                       ,0x278,"(fixup < instNext)","fixup < instNext");
    if (!bVar8) {
LAB_00ea0cfb:
      pcVar6 = (code *)invalidInstructionException();
      (*pcVar6)();
    }
    *puVar14 = 0;
    if (compiler->instNext < uVar10) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar14 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                         ,0x279,"(label <= instNext)","label <= instNext");
      if (!bVar8) goto LAB_00ea0cfb;
      *puVar14 = 0;
    }
  }
  *(uint *)(compiler->instBuf + LVar13) = uVar10;
switchD_00e9f4c1_caseD_1:
  return;
}

Assistant:

void LoopNode::Emit(Compiler& compiler, CharCount& skipped)
    {
        PROBE_STACK_NO_DISPOSE(compiler.scriptContext, Js::Constants::MinStackRegex);

        Assert(skipped == 0);

        switch (scheme)
        {
            case BeginEnd:
            {
                //
                // Compilation scheme:
                //
                //   Lloop: BeginLoop Lexit
                //          <loop body>
                //          RepeatLoop Lloop
                //   Lexit:
                //
                int minBodyGroupId = compiler.program->numGroups;
                int maxBodyGroupId = -1;
                body->AccumDefineGroups(compiler.scriptContext, minBodyGroupId, maxBodyGroupId);
                Label beginLabel = compiler.CurrentLabel();
                Label fixup = compiler.GetFixup(&EMIT(compiler, BeginLoopInst, compiler.NextLoopId(), repeats, !isNotInLoop, !body->isDeterministic, minBodyGroupId, maxBodyGroupId, isGreedy)->exitLabel);
                body->Emit(compiler, skipped);
                EMIT(compiler, RepeatLoopInst, beginLabel);
                compiler.DoFixup(fixup, compiler.CurrentLabel());
                break;
            }

            case None:
            {
                // Nothing to emit
                break;
            }

            case Chomp:
            {
                //
                // Compilation scheme:
                //
                //   Chomp(Char|Set)(Star|Plus|Bounded)
                //
                if(body->firstSet->IsSingleton())
                {
                    if(repeats.lower <= 1 && repeats.IsUnbounded())
                    {
                        if(repeats.lower == 0)
                            EMIT(compiler, ChompCharInst<ChompMode::Star>, body->firstSet->Singleton());
                        else
                            EMIT(compiler, ChompCharInst<ChompMode::Plus>, body->firstSet->Singleton());
                    }
                    else
                        EMIT(compiler, ChompCharBoundedInst, body->firstSet->Singleton(), repeats);
                }
                else
                {
                    if(repeats.lower <= 1 && repeats.IsUnbounded())
                    {
                        if(repeats.lower == 0)
                            EMIT(compiler, ChompSetInst<ChompMode::Star>)->set.CloneFrom(compiler.rtAllocator, *body->firstSet);
                        else
                            EMIT(compiler, ChompSetInst<ChompMode::Plus>)->set.CloneFrom(compiler.rtAllocator, *body->firstSet);
                    }
                    else
                        EMIT(compiler, ChompSetBoundedInst, repeats)->set.CloneFrom(compiler.rtAllocator, *body->firstSet);
                }
                break;
            }

            case ChompGroupLastChar:
            {
                //
                // Compilation scheme:
                //
                //   ChompSetGroup
                //
                Assert(body->tag == DefineGroup);
                DefineGroupNode* bodyGroup = (DefineGroupNode*)body;
                EMIT(compiler, ChompSetBoundedGroupLastCharInst, repeats, bodyGroup->groupId, noNeedToSave)->set.CloneFrom(compiler.rtAllocator, *body->firstSet);
                break;
            }

            case Guarded:
            {
                //
                // Compilation scheme:
                //
                //   Lloop: BeginLoopIf(Char|Set) Lexit
                //          <loop body>
                //          RepeatLoopIf(Char|Set) Lloop
                //   Lexit:
                //
                int minBodyGroupId = compiler.program->numGroups;
                int maxBodyGroupId = -1;
                body->AccumDefineGroups(compiler.scriptContext, minBodyGroupId, maxBodyGroupId);
                Label beginLabel = compiler.CurrentLabel();
                Label exitFixup;
                if (body->firstSet->IsSingleton())
                    exitFixup = compiler.GetFixup(&EMIT(compiler, BeginLoopIfCharInst, body->firstSet->Singleton(), compiler.NextLoopId(), repeats, !isNotInLoop, !body->isDeterministic, minBodyGroupId, maxBodyGroupId)->exitLabel);
                else
                {
                    BeginLoopIfSetInst* i = EMIT(compiler, BeginLoopIfSetInst, compiler.NextLoopId(), repeats, !isNotInLoop, !body->isDeterministic, minBodyGroupId, maxBodyGroupId);
                    i->set.CloneFrom(compiler.rtAllocator, *body->firstSet);
                    exitFixup = compiler.GetFixup(&i->exitLabel);
                }
                body->Emit(compiler, skipped);
                if (body->firstSet->IsSingleton())
                    EMIT(compiler, RepeatLoopIfCharInst, beginLabel);
                else
                    EMIT(compiler, RepeatLoopIfSetInst, beginLabel);
                compiler.DoFixup(exitFixup, compiler.CurrentLabel());
                break;
            }

            case Fixed:
            {
                //
                // Compilation scheme:
                //
                //   Lloop: BeginLoopFixed Lexit
                //          <loop body>
                //          RepeatLoopFixed Lloop
                //   Lexit:
                //
                Assert(!body->ContainsDefineGroup());
                Assert(body->thisConsumes.IsFixed());
                Assert(body->thisConsumes.lower > 0);
                Assert(body->isDeterministic);
                Label beginLabel = compiler.CurrentLabel();
                Label fixup = compiler.GetFixup(&EMIT(compiler, BeginLoopFixedInst, compiler.NextLoopId(), repeats, !isNotInLoop, body->thisConsumes.lower)->exitLabel);
                body->Emit(compiler, skipped);
                EMIT(compiler, RepeatLoopFixedInst, beginLabel);
                compiler.DoFixup(fixup, compiler.CurrentLabel());
                break;
            }

            case FixedSet:
            {
                //
                // Compilation scheme:
                //
                //   LoopSet
                //
                Assert(body->IsSimpleOneChar());
                if (followFirst == MaxChar || PHASE_OFF1(Js::RegexOptBTPhase))
                {
                    EMIT(compiler, LoopSetInst, compiler.NextLoopId(), repeats, !isNotInLoop)->set.CloneFrom(compiler.rtAllocator, *body->firstSet);
                }
                else
                {
                    EMIT(compiler, LoopSetWithFollowFirstInst, compiler.NextLoopId(), repeats, !isNotInLoop, followFirst)->set.CloneFrom(compiler.rtAllocator, *body->firstSet);
                }
                break;
            }

            case FixedGroupLastIteration:
            {
                //
                // Compilation scheme:
                //
                //   Lloop: BeginLoopFixedGroupLastIteration Lexit
                //          <loop body>
                //          RepeatLoopFixedGroupLastIteration Lloop
                //   Lexit:
                //
                Assert(body->tag == DefineGroup);
                DefineGroupNode* bodyGroup = (DefineGroupNode*)body;
                Assert(body->thisConsumes.IsFixed());
                Assert(body->thisConsumes.lower > 0);
                Assert(body->isDeterministic);
                Label beginLabel = compiler.CurrentLabel();
                Label fixup = compiler.GetFixup(&EMIT(compiler, BeginLoopFixedGroupLastIterationInst, compiler.NextLoopId(), repeats, !isNotInLoop, body->thisConsumes.lower, bodyGroup->groupId, noNeedToSave)->exitLabel);
                bodyGroup->body->Emit(compiler, skipped);
                EMIT(compiler, RepeatLoopFixedGroupLastIterationInst, beginLabel);
                compiler.DoFixup(fixup, compiler.CurrentLabel());
                break;
            }

            case GreedyNoBacktrack:
            {
                //
                // Compilation scheme:
                //
                //   Lloop: BeginGreedyLoopNoBacktrack Lexit
                //          <loop body>
                //          RepeatGreedyLoopNoBacktrack Lloop
                //   Lexit:
                //
                Assert(!body->ContainsDefineGroup());
                Assert(isGreedy);
                Assert(repeats.lower == 0);
                Assert(repeats.upper == CharCountFlag);
                Assert(body->isDeterministic);
                Label beginLabel = compiler.CurrentLabel();
                Label fixup = compiler.GetFixup(&EMIT(compiler, BeginGreedyLoopNoBacktrackInst, compiler.NextLoopId())->exitLabel);
                body->Emit(compiler, skipped);
                EMIT(compiler, RepeatGreedyLoopNoBacktrackInst, beginLabel);
                compiler.DoFixup(fixup, compiler.CurrentLabel());
                break;
            }

            case Set:
            {
                //
                // Compilation scheme:
                //
                //   OptMatch(Char|Set)
                //
                Assert(!body->ContainsDefineGroup() || !body->thisConsumes.CouldMatchEmpty());
                if (body->firstSet->IsSingleton())
                    EMIT(compiler, OptMatchCharInst, body->firstSet->Singleton());
                else
                    EMIT(compiler, OptMatchSetInst)->set.CloneFrom(compiler.rtAllocator, *body->firstSet);
                break;
            }

            case Chain:
            {
                //
                // Compilation scheme:
                //
                //          JumpIfNot(Char|Set) Lexit
                //          <body>
                //   Lexit:
                //
                //
                Assert(!body->ContainsDefineGroup() || !body->thisConsumes.CouldMatchEmpty());
                Label jumpFixup = 0;
                CharCount bodySkipped = 0;
                if (body->firstSet->IsSingleton())
                {
                    if (body->SupportsPrefixSkipping(compiler))
                    {
                        jumpFixup = compiler.GetFixup(&EMIT(compiler, MatchCharOrJumpInst, body->firstSet->Singleton())->targetLabel);
                        bodySkipped = 1;
                    }
                    else
                        jumpFixup = compiler.GetFixup(&EMIT(compiler, JumpIfNotCharInst, body->firstSet->Singleton())->targetLabel);
                }
                else
                {
                    if (body->SupportsPrefixSkipping(compiler))
                    {
                        MatchSetOrJumpInst* const i = EMIT(compiler, MatchSetOrJumpInst);
                        i->set.CloneFrom(compiler.rtAllocator, *body->firstSet);
                        jumpFixup = compiler.GetFixup(&i->targetLabel);
                        bodySkipped = 1;
                    }
                    else
                    {
                        JumpIfNotSetInst* const i = EMIT(compiler, JumpIfNotSetInst);
                        i->set.CloneFrom(compiler.rtAllocator, *body->firstSet);
                        jumpFixup = compiler.GetFixup(&i->targetLabel);
                    }
                }
                body->Emit(compiler, bodySkipped);
                compiler.DoFixup(jumpFixup, compiler.CurrentLabel());
                break;
            }

            case Try:
            {
                //
                // Compilation scheme:
                //
                //          Try((If|Match)(Char|Set))? Lexit
                //          <loop body>
                //   Lexit:
                //
                Assert(!body->ContainsDefineGroup() || !body->thisConsumes.CouldMatchEmpty());
                Label tryFixup = 0;
                CharCount bodySkipped = 0;
                // HEURISTIC: if the first set of the body is exact or small, and the
                //            body does not match empty, then it's probably worth using
                //            a Try(If|Match)(Char|Set)
                if (!body->thisConsumes.CouldMatchEmpty() &&
                    (body->isFirstExact || body->firstSet->Count() <= maxCharsForConditionalTry))
                {
                    if (body->SupportsPrefixSkipping(compiler))
                    {
                        if (body->firstSet->IsSingleton())
                            tryFixup = compiler.GetFixup(&EMIT(compiler, TryMatchCharInst, body->firstSet->Singleton())->failLabel);
                        else
                        {
                            TryMatchSetInst* const i = EMIT(compiler, TryMatchSetInst);
                            i->set.CloneFrom(compiler.rtAllocator, *body->firstSet);
                            tryFixup = compiler.GetFixup(&i->failLabel);
                        }
                        bodySkipped = 1;
                    }
                    else
                    {
                        if(body->firstSet->IsSingleton())
                            tryFixup = compiler.GetFixup(&EMIT(compiler, TryIfCharInst, body->firstSet->Singleton())->failLabel);
                        else
                        {
                            TryIfSetInst* const i = EMIT(compiler, TryIfSetInst);
                            i->set.CloneFrom(compiler.rtAllocator, *body->firstSet);
                            tryFixup = compiler.GetFixup(&i->failLabel);
                        }
                    }
                }
                else
                    tryFixup = compiler.GetFixup(&EMIT(compiler, TryInst)->failLabel);
                body->Emit(compiler, bodySkipped);
                // Fixup Try
                compiler.DoFixup(tryFixup, compiler.CurrentLabel());
                break;
            }
        }
    }